

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<kj::Exception::Detail>::dispose(ArrayBuilder<kj::Exception::Detail> *this)

{
  Detail *firstElement;
  RemoveConst<kj::Exception::Detail> *pRVar1;
  Detail *pDVar2;
  Detail *endCopy;
  Detail *posCopy;
  Detail *ptrCopy;
  ArrayBuilder<kj::Exception::Detail> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pDVar2 = this->endPtr;
  if (firstElement != (Detail *)0x0) {
    this->ptr = (Detail *)0x0;
    this->pos = (RemoveConst<kj::Exception::Detail> *)0x0;
    this->endPtr = (Detail *)0x0;
    ArrayDisposer::dispose<kj::Exception::Detail>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 5,
               (long)pDVar2 - (long)firstElement >> 5);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }